

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otherFun.cpp
# Opt level: O0

int set_noblock(int sockfd)

{
  uint uVar1;
  ostream *this;
  int flags;
  int sockfd_local;
  
  if (sockfd < 0) {
    this = std::operator<<((ostream *)&std::cout,"sockfd is invailed");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    flags = -1;
  }
  else {
    uVar1 = fcntl(sockfd,3,0);
    fcntl(sockfd,4,(ulong)(uVar1 | 0x800));
    flags = 1;
  }
  return flags;
}

Assistant:

int set_noblock(int sockfd)
{
    if(sockfd < 0)
    {
        cout<<"sockfd is invailed"<<endl;
        return -1;
    }
    int flags = fcntl(sockfd,F_GETFL,0);
    fcntl(sockfd,F_SETFL,flags | O_NONBLOCK);
    return 1;
}